

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleStructMember(TokenKind kind)

{
  int iVar1;
  bool bVar2;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if ((1 < iVar1 - 0xf9U) && (iVar1 != 0x11)) {
    bVar2 = isPossibleDataType(kind);
    return bVar2;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleStructMember(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}